

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O3

Attribute * __thiscall Imf_2_5::Attribute::newAttribute(Attribute *this,char *typeName)

{
  int iVar1;
  iterator iVar2;
  Attribute *pAVar3;
  ostream *poVar4;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  anon_unknown_0::typeMap();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar2 = std::
          map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
          ::find((map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
                  *)this,(key_type *)typeName);
  if ((_Rb_tree_header *)iVar2._M_node !=
      &anon_unknown_0::typeMap::tMap.super_TypeMap._M_t._M_impl.super__Rb_tree_header) {
    pAVar3 = (Attribute *)(*(code *)iVar2._M_node[1]._M_parent)();
    pthread_mutex_unlock((pthread_mutex_t *)&anon_unknown_0::typeMap::tMap.mutex);
    return pAVar3;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Cannot create image file attribute of unknown type \"",0x34);
  poVar4 = std::operator<<(local_188,(char *)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)asStack_198);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

Attribute *
Attribute::newAttribute (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    TypeMap::const_iterator i = tMap.find (typeName);

    if (i == tMap.end())
	THROW (IEX_NAMESPACE::ArgExc, "Cannot create image file attribute of "
			    "unknown type \"" << typeName << "\".");

    return (i->second)();
}